

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

unique_ptr<named_fstream,_std::default_delete<named_fstream>_> __thiscall
memory::make_unique<named_fstream,char_const(&)[35]>(memory *this,char (*args) [35])

{
  named_fstream *pnVar1;
  allocator local_39;
  string local_38 [32];
  
  pnVar1 = (named_fstream *)operator_new(0x248);
  std::__cxx11::string::string(local_38,*args,&local_39);
  named_fstream::named_fstream(pnVar1,local_38,0x3c);
  *(named_fstream **)this = pnVar1;
  std::__cxx11::string::~string(local_38);
  return (__uniq_ptr_data<named_fstream,_std::default_delete<named_fstream>,_true,_true>)
         (__uniq_ptr_data<named_fstream,_std::default_delete<named_fstream>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
    {
        return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
    }